

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CCDPP.h
# Opt level: O2

value_type_conflict1 __thiscall
CCDPP::rank_one_update
          (CCDPP *this,SparseMatrix *_R,value_type_conflict1 *to_update,
          value_type_conflict1 *the_other,int workload)

{
  thread_pool<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>
  *this_00;
  int iVar1;
  vector<double,_std::allocator<double>_> fun_dec;
  allocator_type local_bd;
  int local_bc;
  double local_b8;
  _Vector_base<double,_std::allocator<double>_> local_b0;
  value_type_conflict1 *local_98;
  value_type_conflict1 *local_90;
  _Bind<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Hui_Li[P]CCDPP_alg_CCDPP_h:98:45)_(int)>
  local_88;
  function0<void> local_50;
  
  local_50.super_function_base.vtable = (vtable_base *)0x0;
  local_bc = workload;
  local_98 = the_other;
  local_90 = to_update;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_b0,
             (long)this->parameter->num_of_thread,(value_type_conflict1 *)&local_50,&local_bd);
  for (iVar1 = 0; this_00 = this->thread_pool, iVar1 < this->parameter->num_of_thread;
      iVar1 = iVar1 + 1) {
    local_88._M_f.workload = &local_bc;
    local_88._M_f.the_other = &local_98;
    local_88._M_f.to_update = &local_90;
    local_88._M_f.fun_dec = (vector<double,_std::allocator<double>_> *)&local_b0;
    local_88._M_f._R = _R;
    local_88._M_f.this = this;
    local_88._M_bound_args.super__Tuple_impl<0UL,_int>.super__Head_base<0UL,_int,_false>.
    _M_head_impl = (_Tuple_impl<0UL,_int>)(_Tuple_impl<0UL,_int>)iVar1;
    boost::function0<void>::
    function0<std::_Bind<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Hui_Li[P]CCDPP_alg_CCDPP_h:98:45)_(int)>_>
              (&local_50,&local_88,0);
    boost::threadpool::
    thread_pool<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>
    ::schedule(this_00,&local_50);
    boost::function0<void>::~function0(&local_50);
  }
  boost::threadpool::
  thread_pool<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>
  ::wait(this_00,(void *)0x0);
  local_b8 = 0.0;
  for (; local_b0._M_impl.super__Vector_impl_data._M_start !=
         local_b0._M_impl.super__Vector_impl_data._M_finish;
      local_b0._M_impl.super__Vector_impl_data._M_start =
           local_b0._M_impl.super__Vector_impl_data._M_start + 1) {
    local_b8 = local_b8 + *local_b0._M_impl.super__Vector_impl_data._M_start;
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_b0);
  return local_b8;
}

Assistant:

inline value_type rank_one_update(SparseMatrix &_R, value_type *to_update, value_type *the_other, const int workload) {

        vector<value_type> fun_dec(parameter->num_of_thread, 0);

        for (int thread_index = 0; thread_index < parameter->num_of_thread; thread_index++) {
            thread_pool->schedule(std::bind([&](const int thread_index) {
                int start = workload * thread_index;
                int end = std::min(workload + start, _R.num_of_cols);

                value_type prev_value;

                for (int col = start; col < end; col++) {
                    // empty column
                    if (_R.ccs_col_ptr[col + 1] == _R.ccs_col_ptr[col]) {
                        continue;
                    }

                    value_type numerator = 0;
                    value_type denominator = parameter->lambda * (_R.ccs_col_ptr[col + 1] -
                                                                  _R.ccs_col_ptr[col]);

                    for (int idx = _R.ccs_col_ptr[col]; idx < _R.ccs_col_ptr[col + 1]; idx++) {
                        int i = _R.ccs_row_idx[idx];
                        numerator += the_other[i] * _R.ccs_rating_scores[idx];
                        denominator += the_other[i] * the_other[i];
                    }

                    prev_value = to_update[col];
                    to_update[col] = numerator / denominator;

                    fun_dec[thread_index] += denominator * sqr(prev_value - to_update[col]);
                }
            }, thread_index));
        }

        thread_pool->wait();

        value_type result = 0;
        for (auto value:fun_dec) {
            result += value;
        }
        return result;
    }